

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.cpp
# Opt level: O0

void __thiscall
Parser::PopFuncBlockScope
          (Parser *this,ParseNodePtr *ppnodeScopeSave,ParseNodePtr *ppnodeExprScopeSave)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ParseNodePtr *ppnodeExprScopeSave_local;
  ParseNodePtr *ppnodeScopeSave_local;
  Parser *this_local;
  
  if ((this->m_ppnodeExprScope != (ParseNodePtr *)0x0) &&
     (*this->m_ppnodeExprScope != (ParseNodePtr)0x0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                       ,0x67f,"(m_ppnodeExprScope == nullptr || *m_ppnodeExprScope == nullptr)",
                       "m_ppnodeExprScope == nullptr || *m_ppnodeExprScope == nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  this->m_ppnodeExprScope = ppnodeExprScopeSave;
  if (this->m_ppnodeScope == (ParseNodePtr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                       ,0x682,"(m_ppnodeScope)","m_ppnodeScope");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (*this->m_ppnodeScope != (ParseNodePtr)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                       ,0x683,"(nullptr == *m_ppnodeScope)","nullptr == *m_ppnodeScope");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  this->m_ppnodeScope = ppnodeScopeSave;
  return;
}

Assistant:

void Parser::PopFuncBlockScope(ParseNodePtr *ppnodeScopeSave, ParseNodePtr *ppnodeExprScopeSave)
{
    Assert(m_ppnodeExprScope == nullptr || *m_ppnodeExprScope == nullptr);
    m_ppnodeExprScope = ppnodeExprScopeSave;

    Assert(m_ppnodeScope);
    Assert(nullptr == *m_ppnodeScope);
    m_ppnodeScope = ppnodeScopeSave;
}